

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O2

bool re2::parse_double_float(char *str,size_t n,bool isfloat,void *dest)

{
  char *__nptr;
  int *piVar1;
  float fVar2;
  double dVar3;
  char *end;
  size_t n_local;
  char buf [201];
  
  if (n != 0) {
    n_local = n;
    __nptr = TerminateNumber(buf,0xc9,str,&n_local,true);
    piVar1 = __errno_location();
    *piVar1 = 0;
    if (isfloat) {
      fVar2 = strtof(__nptr,&end);
      dVar3 = (double)fVar2;
    }
    else {
      dVar3 = strtod(__nptr,&end);
    }
    if ((end == __nptr + n_local) && (*piVar1 == 0)) {
      if (dest == (void *)0x0) {
        return true;
      }
      if (isfloat) {
        *(float *)dest = (float)dVar3;
        return true;
      }
      *(double *)dest = dVar3;
      return true;
    }
  }
  return false;
}

Assistant:

static bool parse_double_float(const char* str, size_t n, bool isfloat,
                               void* dest) {
  if (n == 0) return false;
  static const int kMaxLength = 200;
  char buf[kMaxLength+1];
  str = TerminateNumber(buf, sizeof buf, str, &n, true);
  char* end;
  errno = 0;
  double r;
  if (isfloat) {
    r = strtof(str, &end);
  } else {
    r = strtod(str, &end);
  }
  if (end != str + n) return false;   // Leftover junk
  if (errno) return false;
  if (dest == NULL) return true;
  if (isfloat) {
    *(reinterpret_cast<float*>(dest)) = (float)r;
  } else {
    *(reinterpret_cast<double*>(dest)) = r;
  }
  return true;
}